

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netlist.cpp
# Opt level: O0

vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *
expandVarDecl(NetlistVariableDeclaration *node)

{
  bool bVar1;
  long in_RSI;
  vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *in_RDI;
  NetlistVariableAlias *alias;
  iterator __end2;
  iterator __begin2;
  vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
  *__range2;
  vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *result;
  vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *this;
  vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<netlist::NetlistVariableAlias_**,_std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>_>
  local_40;
  long local_38;
  long local_20;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>::vector
            ((vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_> *)0x184d04);
  bVar1 = std::
          vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
          ::empty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    local_20 = local_10;
    std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>::push_back
              (this,(value_type *)in_RDI);
  }
  else {
    local_38 = local_10 + 0x60;
    local_40._M_current =
         (NetlistVariableAlias **)
         std::
         vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>::
         begin((vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>
                *)in_RDI);
    std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>::
    end((vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_> *
        )in_RDI);
    while (bVar1 = __gnu_cxx::
                   operator==<netlist::NetlistVariableAlias_**,_std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>_>
                             ((__normal_iterator<netlist::NetlistVariableAlias_**,_std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>_>
                               *)this,(__normal_iterator<netlist::NetlistVariableAlias_**,_std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>_>
                                       *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<netlist::NetlistVariableAlias_**,_std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>_>
      ::operator*(&local_40);
      std::vector<netlist::NetlistNode_*,_std::allocator<netlist::NetlistNode_*>_>::push_back
                (this,(value_type *)in_RDI);
      __gnu_cxx::
      __normal_iterator<netlist::NetlistVariableAlias_**,_std::vector<netlist::NetlistVariableAlias_*,_std::allocator<netlist::NetlistVariableAlias_*>_>_>
      ::operator++(&local_40);
    }
  }
  return this;
}

Assistant:

auto expandVarDecl(NetlistVariableDeclaration* node) {
    std::vector<NetlistNode*> result;
    if (node->aliases.empty()) {
        result.push_back(node);
    }
    else {
        for (auto* alias : node->aliases) {
            result.push_back(alias);
        }
    }
    return result;
}